

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O0

void __thiscall LLVMBC::StreamState::append(StreamState *this,ExtractValueInst *ext,bool decl)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint64_t local_48;
  uint local_3c;
  Value *pVStack_38;
  uint i;
  Type *local_30;
  uint64_t local_28;
  undefined1 local_19;
  ExtractValueInst *pEStack_18;
  bool decl_local;
  ExtractValueInst *ext_local;
  StreamState *this_local;
  
  local_19 = decl;
  pEStack_18 = ext;
  ext_local = (ExtractValueInst *)this;
  if (decl) {
    local_28 = Value::get_tween_id((Value *)ext);
    local_30 = Value::getType((Value *)pEStack_18);
    pVStack_38 = ExtractValueInst::getAggregateOperand(pEStack_18);
    append<char_const(&)[2],unsigned_long,char_const(&)[4],char_const(&)[14],LLVMBC::Type*,char_const(&)[2],LLVMBC::Value*>
              (this,(char (*) [2])0x2a90be,&local_28,(char (*) [4])" = ",
               (char (*) [14])"extractvalue ",&local_30,(char (*) [2])0x2a8f72,
               &stack0xffffffffffffffc8);
    for (local_3c = 0; uVar1 = local_3c, uVar2 = ExtractValueInst::getNumIndices(pEStack_18),
        uVar1 < uVar2; local_3c = local_3c + 1) {
      append(this,", ");
      puVar3 = ExtractValueInst::getIndices(pEStack_18);
      append<unsigned_int>(this,puVar3[local_3c]);
    }
  }
  else {
    local_48 = Value::get_tween_id((Value *)ext);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x2a90be,&local_48);
  }
  return;
}

Assistant:

void StreamState::append(ExtractValueInst *ext, bool decl)
{
	if (decl)
	{
		append("%", ext->get_tween_id(), " = ", "extractvalue ", ext->getType(), " ", ext->getAggregateOperand());
		for (unsigned i = 0; i < ext->getNumIndices(); i++)
		{
			append(", ");
			append(ext->getIndices()[i]);
		}
	}
	else
	{
		append("%", ext->get_tween_id());
	}
}